

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

string * __thiscall Search::search::pretty_label_abi_cxx11_(search *this,action a)

{
  char *pcVar1;
  ulong uVar2;
  uint in_EDX;
  undefined8 *in_RSI;
  string *in_RDI;
  ostringstream os;
  substring ss;
  uint32_t in_stack_fffffffffffffe0c;
  namedlabels *in_stack_fffffffffffffe10;
  ostringstream *this_00;
  ostringstream local_1b8 [399];
  allocator local_29;
  substring local_28;
  uint local_14;
  
  if (*(long *)(**(long **)*in_RSI + 0x70) == 0) {
    this_00 = local_1b8;
    local_14 = in_EDX;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::ostream::operator<<(this_00,local_14);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    local_28 = namedlabels::get(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    pcVar1 = local_28.begin;
    uVar2 = (long)local_28.end - (long)local_28.begin;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return in_RDI;
}

Assistant:

string search::pretty_label(action a)
{
  if (this->priv->all->sd->ldict)
  {
    substring ss = this->priv->all->sd->ldict->get(a);
    return string(ss.begin, ss.end - ss.begin);
  }
  else
  {
    ostringstream os;
    os << a;
    return os.str();
  }
}